

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf_reinit__internal(ma_lpf_config *pConfig,void *pHeap,ma_lpf *pLPF,ma_bool32 isNew)

{
  int in_ECX;
  int *in_RDX;
  void *in_RSI;
  int *in_RDI;
  ma_uint32 jlpf2;
  ma_uint32 jlpf1_1;
  size_t lpf2HeapSizeInBytes;
  double a;
  double q;
  ma_lpf2_config lpf2Config;
  ma_uint32 jlpf1;
  size_t lpf1HeapSizeInBytes;
  ma_lpf1_config lpf1Config;
  ma_lpf_heap_layout heapLayout;
  ma_uint32 ilpf2;
  ma_uint32 ilpf1;
  ma_uint32 lpf2Count;
  ma_uint32 lpf1Count;
  ma_result result;
  ma_lpf1 *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint uVar1;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  ma_uint32 in_stack_fffffffffffffefc;
  ma_uint32 in_stack_ffffffffffffff00;
  ma_format in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  ma_uint32 in_stack_ffffffffffffff0c;
  ma_uint32 in_stack_ffffffffffffff10;
  ma_format in_stack_ffffffffffffff14;
  double local_e0;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar2;
  ma_lpf_config *in_stack_ffffffffffffff58;
  ma_lpf2_config *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  ma_lpf2_config *in_stack_ffffffffffffff70;
  size_t local_80;
  long local_78;
  long local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ma_result local_58;
  int local_54;
  int *local_50;
  void *local_48;
  int *local_40;
  ma_result local_34;
  undefined8 local_30;
  size_t *local_28;
  size_t local_20;
  void *local_18;
  double local_10;
  double local_8;
  
  if ((in_RDX == (int *)0x0) || (in_RDI == (int *)0x0)) {
    local_34 = MA_INVALID_ARGS;
  }
  else if ((*in_RDI == 5) || (*in_RDI == 2)) {
    if ((*in_RDX == 0) || (*in_RDX == *in_RDI)) {
      if ((in_RDX[1] == 0) || (in_RDX[1] == in_RDI[1])) {
        if ((uint)in_RDI[6] < 9) {
          local_54 = in_ECX;
          local_50 = in_RDX;
          local_48 = in_RSI;
          local_40 = in_RDI;
          ma_lpf_calculate_sub_lpf_counts(in_RDI[6],&local_5c,&local_60);
          if ((local_54 == 0) && ((local_50[3] != local_5c || (local_50[4] != local_60)))) {
            local_34 = MA_INVALID_OPERATION;
          }
          else {
            if (local_54 == 0) {
              local_28 = &local_80;
              local_30 = 0x18;
              if (local_28 != (size_t *)0x0) {
                memset(local_28,0,0x18);
              }
            }
            else {
              local_58 = ma_lpf_get_heap_layout
                                   (in_stack_ffffffffffffff58,
                                    (ma_lpf_heap_layout *)
                                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
              if (local_58 != MA_SUCCESS) {
                return local_58;
              }
              *(void **)(local_50 + 10) = local_48;
              local_18 = local_48;
              local_20 = local_80;
              if ((local_48 != (void *)0x0) && (local_80 != 0)) {
                memset(local_48,0,local_80);
              }
              *(long *)(local_50 + 6) = (long)local_48 + local_78;
              *(long *)(local_50 + 8) = (long)local_48 + local_70;
            }
            for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
              ma_lpf1_config_init(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                                  in_stack_fffffffffffffefc,
                                  (double)CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0));
              if (local_54 == 0) {
                local_58 = ma_lpf1_reinit((ma_lpf1_config *)
                                          CONCAT44(in_stack_fffffffffffffef4,
                                                   in_stack_fffffffffffffef0),
                                          in_stack_fffffffffffffee8);
              }
              else {
                local_58 = ma_lpf1_get_heap_size
                                     ((ma_lpf1_config *)
                                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                      (size_t *)
                                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
                ;
                if (local_58 == MA_SUCCESS) {
                  local_58 = ma_lpf1_init_preallocated
                                       ((ma_lpf1_config *)
                                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ),
                                        (void *)CONCAT44(in_stack_ffffffffffffff04,
                                                         in_stack_ffffffffffffff00),
                                        (ma_lpf1 *)
                                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ));
                }
              }
              if (local_58 != MA_SUCCESS) {
                for (uVar2 = 0; uVar2 < local_64; uVar2 = uVar2 + 1) {
                  ma_lpf1_uninit((ma_lpf1 *)
                                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                 (ma_allocation_callbacks *)in_stack_fffffffffffffee8);
                }
                return local_58;
              }
            }
            for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
              if (local_5c == 1) {
                local_e0 = (double)(local_68 + 1) * (3.141592653589793 / (double)(uint)local_40[6]);
              }
              else {
                local_e0 = (double)(local_68 * 2 + 1) *
                           (3.141592653589793 / (double)(uint)(local_40[6] * 2));
              }
              local_10 = local_e0;
              local_8 = 1.5707963267948966 - local_e0;
              sin(local_8);
              ma_lpf2_config_init(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                                  in_stack_ffffffffffffff0c,
                                  (double)CONCAT44(in_stack_ffffffffffffff04,
                                                   in_stack_ffffffffffffff00),
                                  (double)CONCAT44(in_stack_fffffffffffffefc,
                                                   in_stack_fffffffffffffef8));
              if (local_54 == 0) {
                local_58 = ma_lpf2_reinit(in_stack_ffffffffffffff60,
                                          (ma_lpf2 *)in_stack_ffffffffffffff58);
              }
              else {
                local_58 = ma_lpf2_get_heap_size
                                     ((ma_lpf2_config *)in_stack_ffffffffffffff58,
                                      (size_t *)
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
                ;
                if (local_58 == MA_SUCCESS) {
                  local_58 = ma_lpf2_init_preallocated
                                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                                        (ma_lpf2 *)in_stack_ffffffffffffff60);
                }
              }
              if (local_58 != MA_SUCCESS) {
                for (uVar2 = 0; uVar2 < local_5c; uVar2 = uVar2 + 1) {
                  ma_lpf1_uninit((ma_lpf1 *)CONCAT44(uVar2,in_stack_fffffffffffffef0),
                                 (ma_allocation_callbacks *)in_stack_fffffffffffffee8);
                }
                for (uVar1 = 0; uVar1 < local_68; uVar1 = uVar1 + 1) {
                  ma_lpf2_uninit((ma_lpf2 *)CONCAT44(uVar2,uVar1),
                                 (ma_allocation_callbacks *)in_stack_fffffffffffffee8);
                }
                return local_58;
              }
            }
            local_50[3] = local_5c;
            local_50[4] = local_60;
            *local_50 = *local_40;
            local_50[1] = local_40[1];
            local_50[2] = local_40[2];
            local_34 = MA_SUCCESS;
          }
        }
        else {
          local_34 = MA_INVALID_ARGS;
        }
      }
      else {
        local_34 = MA_INVALID_OPERATION;
      }
    }
    else {
      local_34 = MA_INVALID_OPERATION;
    }
  }
  else {
    local_34 = MA_INVALID_ARGS;
  }
  return local_34;
}

Assistant:

static ma_result ma_lpf_reinit__internal(const ma_lpf_config* pConfig, void* pHeap, ma_lpf* pLPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;
    ma_lpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pLPF->lpf1Count != lpf1Count || pLPF->lpf2Count != lpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_lpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pLPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pLPF->pLPF1 = (ma_lpf1*)ma_offset_ptr(pHeap, heapLayout.lpf1Offset);
        pLPF->pLPF2 = (ma_lpf2*)ma_offset_ptr(pHeap, heapLayout.lpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);    /* To silence a compiler warning. */
    }

    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        if (isNew) {
            size_t lpf1HeapSizeInBytes;

            result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf1_init_preallocated(&lpf1Config, ma_offset_ptr(pHeap, heapLayout.lpf1Offset + (sizeof(ma_lpf1) * lpf1Count) + (ilpf1 * lpf1HeapSizeInBytes)), &pLPF->pLPF1[ilpf1]);
            }
        } else {
            result = ma_lpf1_reinit(&lpf1Config, &pLPF->pLPF1[ilpf1]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;

            for (jlpf1 = 0; jlpf1 < ilpf1; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        ma_lpf2_config lpf2Config;
        double q;
        double a;

        /* Tempting to use 0.707107, but won't result in a Butterworth filter if the order is > 2. */
        if (lpf1Count == 1) {
            a = (1 + ilpf2*1) * (MA_PI_D/(pConfig->order*1));   /* Odd order. */
        } else {
            a = (1 + ilpf2*2) * (MA_PI_D/(pConfig->order*2));   /* Even order. */
        }
        q = 1 / (2*ma_cosd(a));

        lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t lpf2HeapSizeInBytes;

            result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf2_init_preallocated(&lpf2Config, ma_offset_ptr(pHeap, heapLayout.lpf2Offset + (sizeof(ma_lpf2) * lpf2Count) + (ilpf2 * lpf2HeapSizeInBytes)), &pLPF->pLPF2[ilpf2]);
            }
        } else {
            result = ma_lpf2_reinit(&lpf2Config, &pLPF->pLPF2[ilpf2]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;
            ma_uint32 jlpf2;

            for (jlpf1 = 0; jlpf1 < lpf1Count; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            for (jlpf2 = 0; jlpf2 < ilpf2; jlpf2 += 1) {
                ma_lpf2_uninit(&pLPF->pLPF2[jlpf2], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    pLPF->lpf1Count  = lpf1Count;
    pLPF->lpf2Count  = lpf2Count;
    pLPF->format     = pConfig->format;
    pLPF->channels   = pConfig->channels;
    pLPF->sampleRate = pConfig->sampleRate;

    return MA_SUCCESS;
}